

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall camp::Class::visit(Class *this,ClassVisitor *visitor)

{
  ptr_pointer pprVar1;
  random_access_index_node_impl<std::allocator<char>_> *prVar2;
  random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
  *prVar3;
  random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>_>
  *prVar4;
  
  prVar2 = *(this->m_properties).super_type.ptrs.spc.data_;
  prVar3 = (random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
            *)(prVar2 + -5);
  if (prVar2 == (random_access_index_node_impl<std::allocator<char>_> *)0x0) {
    prVar3 = (random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
              *)0x0;
  }
  if (prVar3 != (this->m_properties).
                super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
                .member) {
    do {
      pprVar1 = *(ptr_pointer *)
                 &(prVar3->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
                  ).
                  super_index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>
                  .super_pod_value_holder<std::shared_ptr<camp::Property>_>.space.data_;
      (*(code *)(*pprVar1)[2].up_)(pprVar1,visitor);
      prVar2 = (prVar3->
               super_random_access_index_node_trampoline<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
               ).super_random_access_index_node_impl<std::allocator<char>_>.up_[1];
      prVar3 = (random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
                *)(prVar2 + -5);
      if (prVar2 == (random_access_index_node_impl<std::allocator<char>_> *)0x0) {
        prVar3 = (random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
                  *)0x0;
      }
    } while (prVar3 != (this->m_properties).
                       super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
                       .member);
  }
  prVar2 = *(this->m_functions).super_type.ptrs.spc.data_;
  while( true ) {
    prVar4 = (random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>_>
              *)(prVar2 + -5);
    if (prVar2 == (random_access_index_node_impl<std::allocator<char>_> *)0x0) {
      prVar4 = (random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>_>
                *)0x0;
    }
    if (prVar4 == (this->m_functions).
                  super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::shared_ptr<camp::Function>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Function,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Function::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>
                  .member) break;
    pprVar1 = *(ptr_pointer *)
               &(prVar4->
                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>
                ).
                super_index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>
                .super_pod_value_holder<std::shared_ptr<camp::Function>_>.space.data_;
    (*(code *)(*pprVar1)[2].up_)(pprVar1,visitor);
    prVar2 = (prVar4->
             super_random_access_index_node_trampoline<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Function>,_std::allocator<std::shared_ptr<camp::Function>_>_>_>_>
             ).super_random_access_index_node_impl<std::allocator<char>_>.up_[1];
  }
  return;
}

Assistant:

void Class::visit(ClassVisitor& visitor) const
{
    // First visit properties
    for (PropertyTable::const_iterator it = m_properties.begin(); it != m_properties.end(); ++it)
    {
        (*it)->accept(visitor);
    }

    // Then visit functions
    for (FunctionTable::const_iterator it = m_functions.begin(); it != m_functions.end(); ++it)
    {
        (*it)->accept(visitor);
    }
}